

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_first_steps_with_multiple_bindings.cpp
# Opt level: O3

int main(void)

{
  long *plVar1;
  controller *pcVar2;
  int iVar3;
  pointer puVar4;
  heap *in_RSI;
  long lVar5;
  bool use_gui_view;
  undefined1 local_6a [2];
  vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  local_68;
  provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_multiple_bindings_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  local_48;
  undefined4 local_40;
  vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  local_38;
  
  local_48.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_boost_ext[P]di_example_tutorial_basic_first_steps_with_multiple_bindings_cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
        *)local_6a;
  local_6a[0] = 1;
  local_40 = 0x2a;
  if (boost::ext::di::v1_3_0::scopes::singleton::
      scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
      create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object == '\0') {
    iVar3 = __cxa_guard_acquire(&boost::ext::di::v1_3_0::scopes::singleton::
                                 scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                                 ::
                                 create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                                 ::object);
    if (iVar3 != 0) {
      boost::ext::di::v1_3_0::scopes::singleton::
      scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
      create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
      ::object = boost::ext::di::v1_3_0::core::successful::
                 provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_iview,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/tutorial/basic_first_steps_with_multiple_bindings.cpp:77:26),_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::array<iclient>,_boost::ext::di::v1_3_0::core::array<iclient,_user,_timer>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                 ::get<boost::ext::di::v1_3_0::type_traits::heap>(&local_48,in_RSI);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<controller*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_001060d8,
                 boost::ext::di::v1_3_0::scopes::singleton::
                 scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
                 create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                 ::object);
      __cxa_atexit(std::__shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &boost::ext::di::v1_3_0::scopes::singleton::
                    scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                    ::
                    create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                    ::object,&__dso_handle);
      __cxa_guard_release(&boost::ext::di::v1_3_0::scopes::singleton::
                           scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                           ::
                           create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
                           ::object);
    }
  }
  pcVar2 = boost::ext::di::v1_3_0::scopes::singleton::
           scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
           create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,iview,main::$_0,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,boost::ext::di::v1_3_0::core::array<iclient>,boost::ext::di::v1_3_0::core::array<i...client,user,timer>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>const&)
           ::object;
  lVar5 = 8;
  puVar4 = (pointer)operator_new(8);
  (puVar4->_M_t).super___uniq_ptr_impl<iclient,_std::default_delete<iclient>_>._M_t.
  super__Tuple_impl<0UL,_iclient_*,_std::default_delete<iclient>_>.
  super__Head_base<0UL,_iclient_*,_false>._M_head_impl = (iclient *)&PTR__iclient_00105d40;
  local_68.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(8);
  ((local_68.
    super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
  super___uniq_ptr_impl<iclient,_std::default_delete<iclient>_>._M_t.
  super__Tuple_impl<0UL,_iclient_*,_std::default_delete<iclient>_>.
  super__Head_base<0UL,_iclient_*,_false>._M_head_impl = (iclient *)&PTR__iclient_00105d90;
  local_68.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar4;
  std::
  vector<std::unique_ptr<iclient,std::default_delete<iclient>>,std::allocator<std::unique_ptr<iclient,std::default_delete<iclient>>>>
  ::vector<std::move_iterator<std::unique_ptr<iclient,std::default_delete<iclient>>*>,void>
            ((vector<std::unique_ptr<iclient,std::default_delete<iclient>>,std::allocator<std::unique_ptr<iclient,std::default_delete<iclient>>>>
              *)&local_38,(unique_ptr<iclient,_std::default_delete<iclient>_> *)&local_68,
             (move_iterator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_*>)
             &local_68.
              super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(allocator_type *)(local_6a + 1));
  do {
    plVar1 = *(long **)((long)&local_68.
                               super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    *(undefined8 *)
     ((long)&local_68.
             super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5) = 0;
    lVar5 = lVar5 + -8;
  } while (lVar5 != -8);
  local_68.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ::~vector(&local_38);
  app::app((app *)&local_38,pcVar2,&local_68);
  std::
  vector<std::unique_ptr<iclient,_std::default_delete<iclient>_>,_std::allocator<std::unique_ptr<iclient,_std::default_delete<iclient>_>_>_>
  ::~vector(&local_68);
  return 0;
}

Assistant:

int main() {
  auto use_gui_view = true;

  // clang-format off
  auto injector = di::make_injector(
    di::bind<iview>().to([&](const auto& injector) -> iview& {
      if (use_gui_view)
        return injector.template create<gui_view&>();
      else
        return injector.template create<text_view&>();
    })
  , di::bind<int>().to(42) // renderer device
  , di::bind<iclient*[]>().to<user, timer>() // bind many clients
  );
  // clang-format on

  injector.create<app>();
}